

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

FuncDef * sqlite3FunctionSearch(int h,char *zFunc)

{
  byte bVar1;
  FuncDef *pFVar2;
  long lVar3;
  
  pFVar2 = sqlite3BuiltinFunctions.a[h];
joined_r0x001c24b1:
  if (pFVar2 == (FuncDef *)0x0) {
    return (FuncDef *)0x0;
  }
  lVar3 = 0;
  do {
    bVar1 = pFVar2->zName[lVar3];
    if (bVar1 == zFunc[lVar3]) {
      if ((ulong)bVar1 == 0) {
        return pFVar2;
      }
    }
    else if (""[bVar1] != ""[(byte)zFunc[lVar3]]) break;
    lVar3 = lVar3 + 1;
  } while( true );
  pFVar2 = (pFVar2->u).pHash;
  goto joined_r0x001c24b1;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FunctionSearch(
  int h,               /* Hash of the name */
  const char *zFunc    /* Name of function */
){
  FuncDef *p;
  for(p=sqlite3BuiltinFunctions.a[h]; p; p=p->u.pHash){
    if( sqlite3StrICmp(p->zName, zFunc)==0 ){
      return p;
    }
  }
  return 0;
}